

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O0

void __thiscall duplicate_option_clash::test_method(duplicate_option_clash *this)

{
  undefined8 uVar1;
  bool bVar2;
  pointer poVar3;
  vw_exception *ex;
  option_group_definition arg_group;
  unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_> options;
  unique_ptr<char_*,_std::default_delete<char_*>_> argv;
  int argc;
  char command_line [16];
  char char_opt;
  int int_opt;
  pointer in_stack_fffffffffffffc48;
  undefined1 pv_;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  undefined6 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
  *in_stack_fffffffffffffc60;
  char **in_stack_fffffffffffffc90;
  allocator *paVar4;
  undefined8 in_stack_fffffffffffffc98;
  int argc_00;
  typed_option<int> *op;
  options_boost_po *in_stack_fffffffffffffca0;
  option_group_definition *this_00;
  basic_cstring<const_char> local_2d0;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [24];
  undefined1 local_288 [16];
  basic_cstring<const_char> local_278;
  undefined1 local_268 [16];
  basic_cstring<const_char> local_258;
  allocator local_241;
  string local_240 [199];
  undefined1 local_179 [200];
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [72];
  option_group_definition local_48;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  local_48.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x68742d2d20657865;
  local_48.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x732074706f5f65;
  convert_to_command_args
            ((char *)in_stack_fffffffffffffc60,
             (int *)CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)),
             in_stack_fffffffffffffc54);
  std::unique_ptr<char*,std::default_delete<char*>>::unique_ptr<std::default_delete<char*>,void>
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (pointer)in_stack_fffffffffffffc48);
  operator_new(0x2e8);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::get
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  VW::config::options_boost_po::options_boost_po
            (in_stack_fffffffffffffca0,argc_00,in_stack_fffffffffffffc90);
  this_00 = &local_48;
  std::unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>>::
  unique_ptr<std::default_delete<VW::config::options_boost_po>,void>
            ((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             in_stack_fffffffffffffc48);
  std::unique_ptr<VW::config::options_i,std::default_delete<VW::config::options_i>>::
  unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>,void>
            (in_stack_fffffffffffffc60,
             (unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)CONCAT17(in_stack_fffffffffffffc5f,
                         CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
  std::unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
  ::~unique_ptr((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
                 *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"group",&local_b1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (string *)in_stack_fffffffffffffc48);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  op = (typed_option<int> *)local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_179 + 1),"the_opt",(allocator *)op);
  VW::config::make_option<int>
            ((string *)
             CONCAT17(in_stack_fffffffffffffc5f,
                      CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)),
             (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  VW::config::option_group_definition::add<VW::config::typed_option<int>>(this_00,op);
  VW::config::typed_option<int>::~typed_option
            ((typed_option<int> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::__cxx11::string::~string((string *)(local_179 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  paVar4 = &local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"the_opt",paVar4);
  VW::config::make_option<char>
            ((string *)
             CONCAT17(in_stack_fffffffffffffc5f,
                      CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)),
             (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  VW::config::option_group_definition::add<VW::config::typed_option<char>>
            (this_00,(typed_option<char> *)op);
  VW::config::typed_option<char>::~typed_option
            ((typed_option<char> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0xa7,local_268);
    poVar3 = std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::
             operator->((unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
                         *)0x19825d);
    (**poVar3->_vptr_options_i)(poVar3,local_90);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      pv_ = (undefined1)((ulong)in_stack_fffffffffffffc48 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_278,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_278,0xa7,local_288);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)
                 CONCAT17(in_stack_fffffffffffffc5f,
                          CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)),
                 (char (*) [51])CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x78);
      in_stack_fffffffffffffc48 = (pointer)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2a0,local_2c0,&local_2d0,0xa7,1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>
                          *)0x198364);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x198371);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    in_stack_fffffffffffffc5e = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc5e);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::~unique_ptr
            (in_stack_fffffffffffffc60);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::~unique_ptr
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(duplicate_option_clash) {
  int int_opt;
  char char_opt;

  char command_line[] = "exe --the_opt s";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group");
  arg_group.add(make_option("the_opt", int_opt));
  arg_group.add(make_option("the_opt", char_opt));

  BOOST_CHECK_THROW(options->add_and_parse(arg_group), VW::vw_exception);
}